

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void msg(char *format,...)

{
  return;
}

Assistant:

void msg(char *format, ...)
{
    return;
    /*
    char buffer[2048];
    va_list  va;
    va_start(va, format);
    vsnprintf(buffer, sizeof(buffer), format, va);
    va_end(va);
    struct timeval tv;
    gettimeofday(&tv, NULL);
    struct tm ltm;
    localtime_r(&tv.tv_sec, &ltm);
    unsigned int ms = (unsigned int)(tv.tv_usec / 1000);
    uint64_t thistime = tv.tv_sec * 1000 + ms;
    printf("%02u:%02u:%02u.%03u +%03lu: %s\n", ltm.tm_hour, ltm.tm_min, ltm.tm_sec,
           ms, lasttime ? (thistime - lasttime) : 0, buffer);
    lasttime = thistime;
    va_end(va);
    */
}